

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * kwssys::SystemTools::CropString(string *__return_storage_ptr__,string *s,size_t max_len)

{
  ulong uVar1;
  string local_40 [32];
  
  if ((max_len == 0) || (s->_M_string_length <= max_len)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    uVar1 = max_len >> 1;
    std::__cxx11::string::assign((string *)__return_storage_ptr__,(ulong)s,0);
    std::__cxx11::string::substr((ulong)local_40,(ulong)s);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_40);
    if (((2 < max_len) && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1] = '.', max_len != 3))
       && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] = '.', 4 < max_len)) {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar1 + 1] = '.';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CropString(const std::string& s, size_t max_len)
{
  if (s.empty() || max_len == 0 || max_len >= s.size()) {
    return s;
  }

  std::string n;
  n.reserve(max_len);

  size_t middle = max_len / 2;

  n.assign(s, 0, middle);
  n += s.substr(s.size() - (max_len - middle));

  if (max_len > 2) {
    n[middle] = '.';
    if (max_len > 3) {
      n[middle - 1] = '.';
      if (max_len > 4) {
        n[middle + 1] = '.';
      }
    }
  }

  return n;
}